

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv.h
# Opt level: O0

uint32_t deref32(void *ptr)

{
  void *ptr_local;
  
  return *ptr;
}

Assistant:

INLINE uint32_t deref32(const void *ptr)
{
#ifdef _ALIGN_MEM_ACCESS
    // 4-byte align check (rightmost 2 bits must be '00')
    if ( (size_t)ptr & 0x3 ) {
        uint32_t value;
        memcpy(&value, ptr, sizeof(uint32_t));
        return value;
    }
#endif
    return *(uint32_t*)ptr;
}